

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_C2S_REQUEST_check(void)

{
  uint __line;
  int32_t iVar1;
  char *__assertion;
  uint8_t buf5 [2];
  uint8_t buf6 [3];
  uint8_t buf7 [10];
  uint8_t buf4 [19];
  uint8_t buf3 [19];
  uint8_t buf2 [19];
  uint8_t buf1 [19];
  PipeMsg msg;
  
  MsgHelper::initMsg(&msg,C2S_REQUEST);
  buf1[0] = '\x01';
  buf1[1] = '\x01';
  buf1[2] = '\x03';
  buf1[3] = '\r';
  buf1[4] = 'w';
  buf1[5] = 'w';
  buf1[6] = 'w';
  buf1[7] = '.';
  buf1[8] = 'b';
  buf1[9] = 'a';
  buf1[10] = 'i';
  buf1[0xb] = 'd';
  buf1[0xc] = 'u';
  buf1[0xd] = '.';
  buf1[0xe] = 'c';
  buf1[0xf] = 'o';
  buf1[0x10] = 'm';
  buf1[0x11] = 0x8c;
  buf1[0x12] = '\x01';
  iVar1 = MsgHelper::deserializeMsg(buf1,0x13,&msg);
  if (iVar1 == 0x13) {
    MsgHelper::destroyMsg(&msg);
    buf2[0] = '\x01';
    buf2[1] = '\x01';
    buf2[2] = '\x03';
    buf2[3] = '\x0e';
    buf2[4] = 'w';
    buf2[5] = 'w';
    buf2[6] = 'w';
    buf2[7] = '.';
    buf2[8] = 'b';
    buf2[9] = 'a';
    buf2[10] = 'i';
    buf2[0xb] = 'd';
    buf2[0xc] = 'u';
    buf2[0xd] = '.';
    buf2[0xe] = 'c';
    buf2[0xf] = 'o';
    buf2[0x10] = 'm';
    buf2[0x11] = 0x8c;
    buf2[0x12] = '\x01';
    iVar1 = MsgHelper::deserializeMsg(buf2,0x13,&msg);
    if (iVar1 == 0) {
      MsgHelper::destroyMsg(&msg);
      buf3[0] = '\x01';
      buf3[1] = '\x01';
      buf3[2] = '\x03';
      buf3[3] = '\f';
      buf3[4] = 'w';
      buf3[5] = 'w';
      buf3[6] = 'w';
      buf3[7] = '.';
      buf3[8] = 'b';
      buf3[9] = 'a';
      buf3[10] = 'i';
      buf3[0xb] = 'd';
      buf3[0xc] = 'u';
      buf3[0xd] = '.';
      buf3[0xe] = 'c';
      buf3[0xf] = 'o';
      buf3[0x10] = 'm';
      buf3[0x11] = 0x8c;
      buf3[0x12] = '\x01';
      iVar1 = MsgHelper::deserializeMsg(buf3,0x13,&msg);
      if (iVar1 != 0x12) {
        __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 18",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                      ,0x80,"void test_C2S_REQUEST_check()");
      }
      MsgHelper::destroyMsg(&msg);
      builtin_memcpy(buf4,"\x01\x01\x03",4);
      buf4[4] = 'w';
      buf4[5] = 'w';
      buf4[6] = 'w';
      buf4[7] = '.';
      buf4[8] = 'b';
      buf4[9] = 'a';
      buf4[10] = 'i';
      buf4[0xb] = 'd';
      buf4[0xc] = 'u';
      buf4[0xd] = '.';
      buf4[0xe] = 'c';
      buf4[0xf] = 'o';
      buf4[0x10] = 'm';
      buf4[0x11] = 0x8c;
      buf4[0x12] = '\x01';
      iVar1 = MsgHelper::deserializeMsg(buf4,0x13,&msg);
      if (iVar1 != -1) {
        __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                      ,0x8a,"void test_C2S_REQUEST_check()");
      }
      MsgHelper::destroyMsg(&msg);
      buf5[0] = '\x01';
      buf5[1] = 0xdd;
      iVar1 = MsgHelper::deserializeMsg(buf5,2,&msg);
      if (iVar1 != -1) {
        __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                      ,0x8f,"void test_C2S_REQUEST_check()");
      }
      MsgHelper::destroyMsg(&msg);
      buf6[2] = 0xdd;
      buf6[0] = '\x01';
      buf6[1] = '\x01';
      iVar1 = MsgHelper::deserializeMsg(buf6,3,&msg);
      if (iVar1 == -1) {
        MsgHelper::destroyMsg(&msg);
        buf7[0] = '\x01';
        buf7[1] = '\x01';
        buf7[2] = '\x01';
        buf7[3] = '/';
        buf7[4] = 'K';
        buf7[5] = 0xda;
        buf7[6] = 200;
        buf7[7] = 0xff;
        buf7[8] = 0xf1;
        buf7[9] = 0xdd;
        iVar1 = MsgHelper::deserializeMsg(buf7,10,&msg);
        if (iVar1 == 9) {
          MsgHelper::destroyMsg(&msg);
          return;
        }
        __assert_fail("MsgHelper::deserializeMsg(buf7, sizeof(buf7), &msg) == 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                      ,0x99,"void test_C2S_REQUEST_check()");
      }
      __assert_fail("MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                    ,0x94,"void test_C2S_REQUEST_check()");
    }
    __assertion = "MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == 0";
    __line = 0x77;
  }
  else {
    __assertion = "MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 19";
    __line = 0x6d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,__line,"void test_C2S_REQUEST_check()");
}

Assistant:

void test_C2S_REQUEST_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::C2S_REQUEST);
	
	const uint8_t buf1[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 19);
	MsgHelper::destroyMsg(&msg);
	
	
	const uint8_t buf2[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0E, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf3[] = {
		0x01, 
		0x01, 
		0x03, 
		0x0C, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == 18);
	MsgHelper::destroyMsg(&msg);
	
	// error: domain len (0x00)
	const uint8_t buf4[] = {
		0x01, 
		0x01, 
		0x03, 
		0x00, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 
		0x8C, 0x01};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: cmd(0xdd) overflow
	const uint8_t buf5[] = {0x01, 0xdd,};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: atyp(0xdd) overflow
	const uint8_t buf6[] = {0x01,  0x01, 0xdd};
	assert(MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	
	const uint8_t buf7[] = {0x01, 0x01, 0x01, 0x2F, 0x4B, 0xDA, 0xC8, 0xFF, 0xF1, 0xDD};
	assert(MsgHelper::deserializeMsg(buf7, sizeof(buf7), &msg) == 9);
	MsgHelper::destroyMsg(&msg);
}